

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_tuple_demo.cpp
# Opt level: O0

int main(void)

{
  type *ptVar1;
  ostream *poVar2;
  type *ptVar3;
  Customer customer;
  float in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  NamedTuple<int,_CustomerId,_float,_Balance> *in_stack_fffffffffffffff0;
  
  aosoa::NamedTuple<int,_CustomerId,_float,_Balance>::NamedTuple<float>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  ptVar1 = aosoa::NamedTuple<int,_CustomerId,_float,_Balance>::get<CustomerId>
                     ((NamedTuple<int,_CustomerId,_float,_Balance> *)&stack0xfffffffffffffff4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*ptVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ptVar3 = aosoa::NamedTuple<int,_CustomerId,_float,_Balance>::get<Balance>
                     (in_stack_fffffffffffffff0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*ptVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  Customer customer(1, 2.7F);

  // Access tuple elements through their name (type)
  // Element name resolution is done at compile-time. The naming of the tuple
  // elements is essentially free
  std::cout << customer.get<CustomerId>() << std::endl;
  std::cout << customer.get<Balance>() << std::endl;

  return EXIT_SUCCESS;
}